

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O3

void * CommandsThread(void *pParam)

{
  FILE *__stream;
  char *pcVar1;
  char line [256];
  timespec local_148;
  byte local_138;
  char local_137;
  
  puts("Type a command (e.g. help) or exit to terminate the program.");
  do {
    memset(&local_138,0,0x100);
    __stream = _stdin;
    while( true ) {
      while (pcVar1 = fgets((char *)&local_138,0x100,__stream), 0x24 < local_138) {
        if (local_138 == 0x25) goto LAB_0012c36c;
        if (((local_138 != 0x2f) || (pcVar1 == (char *)0x0)) || (local_137 != '/'))
        goto LAB_0012c378;
      }
      if (local_138 != 0x23) break;
LAB_0012c36c:
      if (pcVar1 == (char *)0x0) goto LAB_0012c38d;
    }
    if (local_138 == 0x24) goto LAB_0012c38d;
LAB_0012c378:
    if (pcVar1 == (char *)0x0) {
LAB_0012c38d:
      if (bExit != 0) {
        return (void *)0x0;
      }
      puts("Invalid command or stdin failure.");
      local_148.tv_sec = 0;
      local_148.tv_nsec = 100000000;
      nanosleep(&local_148,(timespec *)0x0);
    }
    else {
      if (bExit != 0) {
        return (void *)0x0;
      }
      Commands((char *)&local_138);
    }
    if (bExit != 0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE CommandsThread(void* pParam)
{
	char line[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	printf("Type a command (e.g. help) or exit to terminate the program.\n");

	// Read and execute commands from stdin.
	for (;;)
	{
		// fgets() should be a blocking call.
		// How to cancel it properly?

		memset(line, 0, sizeof(line));
		if (fgets3(stdin, line, sizeof(line)) != NULL)
		{
			if (bExit) break;
			Commands(line);
		}
		else
		{
			if (bExit) break;
			printf("Invalid command or stdin failure.\n");
			mSleep(100);
		}

		if (bExit) break;
	}

	return 0;
}